

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O0

bool __thiscall
Pda::checkForTrans(Pda *this,
                  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *v,
                  Transition *t)

{
  Transition *this_00;
  bool bVar1;
  reference ppTVar2;
  Node *pNVar3;
  Node *pNVar4;
  Transition *trans;
  iterator __end1;
  iterator __begin1;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *__range1;
  Transition *t_local;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *v_local;
  Pda *this_local;
  
  __end1 = std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::begin
                     (v);
  trans = (Transition *)
          std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::end(v);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Tjen::Node::Transition_**,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
                                *)&trans);
    if (!bVar1) {
      return false;
    }
    ppTVar2 = __gnu_cxx::
              __normal_iterator<Tjen::Node::Transition_**,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppTVar2;
    pNVar3 = Tjen::Node::Transition::getTo(t);
    pNVar4 = Tjen::Node::Transition::getTo(this_00);
    if (pNVar3 == pNVar4) {
      pNVar3 = Tjen::Node::Transition::getFrom(t);
      pNVar4 = Tjen::Node::Transition::getFrom(this_00);
      if (pNVar3 == pNVar4) {
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<Tjen::Node::Transition_**,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool Pda::checkForTrans(std::vector<Tjen::Node::Transition*> &v, Tjen::Node::Transition *t) {
    for (Tjen::Node::Transition* trans:v) {
        if(t->getTo() == trans->getTo()  && t->getFrom() == trans->getFrom()){ return true;}

    }
    return false;
}